

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode setstropt_userpwd(char *option,char **userp,char **passwdp)

{
  CURLcode CVar1;
  size_t len;
  char **passwdp_00;
  char **userp_00;
  CURLcode CVar2;
  char *user;
  char *passwd;
  
  user = (char *)0x0;
  passwd = (char *)0x0;
  if (option != (char *)0x0) {
    len = strlen(option);
    userp_00 = &user;
    if (userp == (char **)0x0) {
      userp_00 = (char **)0x0;
    }
    passwdp_00 = &passwd;
    if (passwdp == (char **)0x0) {
      passwdp_00 = (char **)0x0;
    }
    CVar1 = parse_login_details(option,len,userp_00,passwdp_00,(char **)0x0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  CVar2 = CURLE_OK;
  CVar1 = CURLE_OK;
  if (userp != (char **)0x0) {
    CVar1 = CVar2;
    if (((option != (char *)0x0) && (user == (char *)0x0)) && (*option == ':')) {
      user = (*Curl_cstrdup)("");
      CVar1 = CURLE_OUT_OF_MEMORY;
      if (user != (char *)0x0) {
        CVar1 = CURLE_OK;
      }
    }
    (*Curl_cfree)(*userp);
    *userp = user;
  }
  if (passwdp != (char **)0x0) {
    (*Curl_cfree)(*passwdp);
    *passwdp = passwd;
  }
  return CVar1;
}

Assistant:

static CURLcode setstropt_userpwd(char *option, char **userp, char **passwdp)
{
  CURLcode result = CURLE_OK;
  char *user = NULL;
  char *passwd = NULL;

  /* Parse the login details if specified. It not then we treat NULL as a hint
     to clear the existing data */
  if(option) {
    result = parse_login_details(option, strlen(option),
                                 (userp ? &user : NULL),
                                 (passwdp ? &passwd : NULL),
                                 NULL);
  }

  if(!result) {
    /* Store the username part of option if required */
    if(userp) {
      if(!user && option && option[0] == ':') {
        /* Allocate an empty string instead of returning NULL as user name */
        user = strdup("");
        if(!user)
          result = CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(*userp);
      *userp = user;
    }

    /* Store the password part of option if required */
    if(passwdp) {
      Curl_safefree(*passwdp);
      *passwdp = passwd;
    }
  }

  return result;
}